

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseTypeIdent(Parser *this,Type *type)

{
  undefined8 uVar1;
  undefined8 uVar2;
  EnumDef *pEVar3;
  StructDef *pSVar4;
  undefined8 *in_RDX;
  CheckedError *ce;
  string id;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,type[1].struct_def,
             (long)&((type[1].enum_def)->super_Definition).name._M_dataplus._M_p +
             (long)&((type[1].struct_def)->super_Definition).name._M_dataplus._M_p);
  Expect(this,(int)type);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    ParseNamespacing(this,(string *)type,&local_40);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      pEVar3 = LookupEnum((Parser *)type,&local_40);
      if (pEVar3 == (EnumDef *)0x0) {
        *(undefined4 *)in_RDX = 0xf;
        pSVar4 = LookupCreateStruct((Parser *)type,&local_40,true,false);
        in_RDX[1] = pSVar4;
      }
      else {
        uVar1 = *(undefined8 *)&pEVar3->underlying_type;
        pSVar4 = (pEVar3->underlying_type).struct_def;
        uVar2 = *(undefined8 *)((long)&(pEVar3->underlying_type).enum_def + 2);
        *(undefined8 *)((long)in_RDX + 10) =
             *(undefined8 *)((long)&(pEVar3->underlying_type).struct_def + 2);
        *(undefined8 *)((long)in_RDX + 0x12) = uVar2;
        *in_RDX = uVar1;
        in_RDX[1] = pSVar4;
        if (pEVar3->is_union == true) {
          *(undefined4 *)in_RDX = 0x10;
        }
      }
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTypeIdent(Type &type) {
  std::string id = attribute_;
  EXPECT(kTokenIdentifier);
  ECHECK(ParseNamespacing(&id, nullptr));
  auto enum_def = LookupEnum(id);
  if (enum_def) {
    type = enum_def->underlying_type;
    if (enum_def->is_union) type.base_type = BASE_TYPE_UNION;
  } else {
    type.base_type = BASE_TYPE_STRUCT;
    type.struct_def = LookupCreateStruct(id);
  }
  return NoError();
}